

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

void __thiscall
mp::internal::TextReader<fmt::Locale>::DoReportError
          (TextReader<fmt::Locale> *this,char *loc,CStringRef format_str,ArgList *args)

{
  char cVar1;
  char *pcVar2;
  ReadError *this_00;
  char *pcVar3;
  int line;
  bool bVar4;
  
  line = this->line_;
  pcVar2 = this->line_start_;
  if (loc < pcVar2) {
    pcVar3 = loc + -(ulong)(*loc == '\n');
    do {
      cVar1 = *pcVar3;
      pcVar2 = pcVar3 + -1;
      if (cVar1 == '\n') break;
      bVar4 = pcVar3 != (this->super_ReaderBase).start_;
      pcVar3 = pcVar2;
    } while (bVar4);
    line = line + -1;
    pcVar2 = pcVar2 + (ulong)(cVar1 == '\n') + 1;
  }
  this_00 = (ReadError *)__cxa_allocate_exception(0x40);
  ReadError::ReadError
            (this_00,(CStringRef)(this->super_ReaderBase).name_._M_dataplus._M_p,line,
             ((int)loc - (int)pcVar2) + 1,format_str,*args);
  __cxa_throw(this_00,&ReadError::typeinfo,ReadError::~ReadError);
}

Assistant:

void mp::internal::TextReader<Locale>::DoReportError(
    const char *loc, fmt::CStringRef format_str, const fmt::ArgList &args) {
  int line = line_;
  const char *line_start = line_start_;
  if (loc < line_start) {
    --line;
    // Find the beginning of the previous line.
    line_start = loc;
    if (*line_start == '\n')
      --line_start;
    while (*line_start != '\n' && line_start != start_)
      --line_start;
    if (*line_start == '\n')
      ++line_start;
  }
  int column = static_cast<int>(loc - line_start + 1);
  throw ReadError(name_, line, column, format_str, args);
}